

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O1

void GREATEST_SET_SETUP_CB(undefined1 *cb,void *udata)

{
  greatest_info.setup = cb;
  greatest_info.setup_udata = udata;
  return;
}

Assistant:

int main(int argc, char *argv[])
{
	GREATEST_MAIN_BEGIN();

	srand(time(NULL));

	tinf_init();

	RUN_SUITE(tinflate);
	RUN_SUITE(tinfzlib);
	RUN_SUITE(tinfgzip);

	GREATEST_MAIN_END();
}